

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

int ImfHeaderM44fAttribute(ImfHeader *hdr,char *name,float (*m) [4])

{
  TypedAttribute<Imath_3_2::Matrix44<float>_> *pTVar1;
  
  pTVar1 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>>
                     ((Header *)hdr,name);
  (*m)[0] = (pTVar1->_value).x[0][0];
  (*m)[1] = (pTVar1->_value).x[0][1];
  (*m)[2] = (pTVar1->_value).x[0][2];
  (*m)[3] = (pTVar1->_value).x[0][3];
  m[1][0] = (pTVar1->_value).x[1][0];
  m[1][1] = (pTVar1->_value).x[1][1];
  m[1][2] = (pTVar1->_value).x[1][2];
  m[1][3] = (pTVar1->_value).x[1][3];
  m[2][0] = (pTVar1->_value).x[2][0];
  m[2][1] = (pTVar1->_value).x[2][1];
  m[2][2] = (pTVar1->_value).x[2][2];
  m[2][3] = (pTVar1->_value).x[2][3];
  m[3][0] = (pTVar1->_value).x[3][0];
  m[3][1] = (pTVar1->_value).x[3][1];
  m[3][2] = (pTVar1->_value).x[3][2];
  m[3][3] = (pTVar1->_value).x[3][3];
  return 1;
}

Assistant:

int
ImfHeaderM44fAttribute (const ImfHeader* hdr, const char name[], float m[4][4])
{
    try
    {
        const M44f& m4 =
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::M44fAttribute> (name)
                .value ();

        m[0][0] = m4[0][0];
        m[0][1] = m4[0][1];
        m[0][2] = m4[0][2];
        m[0][3] = m4[0][3];

        m[1][0] = m4[1][0];
        m[1][1] = m4[1][1];
        m[1][2] = m4[1][2];
        m[1][3] = m4[1][3];

        m[2][0] = m4[2][0];
        m[2][1] = m4[2][1];
        m[2][2] = m4[2][2];
        m[2][3] = m4[2][3];

        m[3][0] = m4[3][0];
        m[3][1] = m4[3][1];
        m[3][2] = m4[3][2];
        m[3][3] = m4[3][3];

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}